

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.c++
# Opt level: O0

bool __thiscall capnp::AnyStruct::Reader::operator==(Reader *this,Reader right)

{
  Equality EVar1;
  Fault local_50;
  Fault f;
  Reader *this_local;
  
  f.exception = (Exception *)right._reader.segment;
  EVar1 = equals(this,right);
  if (EVar1 == NOT_EQUAL) {
    this_local._7_1_ = false;
  }
  else {
    if (EVar1 != EQUAL) {
      if (EVar1 != UNKNOWN_CONTAINS_CAPS) {
        kj::_::unreachable();
      }
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[107]>
                (&local_50,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any.c++"
                 ,0xf7,FAILED,(char *)0x0,
                 "\"operator== cannot determine equality of capabilities; use equals() instead if you need to handle this case\""
                 ,(char (*) [107])
                  "operator== cannot determine equality of capabilities; use equals() instead if you need to handle this case"
                );
      kj::_::Debug::Fault::fatal(&local_50);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool AnyStruct::Reader::operator==(AnyStruct::Reader right) const {
  switch(equals(right)) {
    case Equality::EQUAL:
      return true;
    case Equality::NOT_EQUAL:
      return false;
    case Equality::UNKNOWN_CONTAINS_CAPS:
      KJ_FAIL_REQUIRE(
        "operator== cannot determine equality of capabilities; use equals() instead if you need to handle this case");
  }
  KJ_UNREACHABLE;
}